

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LinkedList<soul::heart::Statement> *this_00;
  undefined8 *puVar1;
  __fn *p_Var2;
  Statement *pSVar3;
  Iterator predecessor;
  Terminator *pTVar4;
  undefined8 *puVar5;
  Iterator __begin2;
  pool_ref<soul::heart::Variable> local_40;
  __fn *local_38;
  
  puVar1 = *(undefined8 **)((long)__child_stack + 0x28);
  local_38 = __fn;
  for (puVar5 = *(undefined8 **)((long)__child_stack + 0x20); p_Var2 = local_38, puVar5 != puVar1;
      puVar5 = puVar5 + 1) {
    local_40.object = cloneVariable(this,(Variable *)*puVar5);
    std::
    vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
    ::emplace_back<soul::pool_ref<soul::heart::Variable>>
              ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                *)(__fn + 0x20),&local_40);
  }
  local_40.object = *(Variable **)((long)__child_stack + 0x38);
  this_00 = (LinkedList<soul::heart::Statement> *)(local_38 + 0x38);
  predecessor.object = (Statement *)0x0;
  while (local_40.object != (Variable *)0x0) {
    pSVar3 = LinkedList<soul::heart::Statement>::Iterator::operator*((Iterator *)&local_40);
    pSVar3 = cloneStatement(this,pSVar3);
    predecessor = LinkedList<soul::heart::Statement>::insertAfter(this_00,predecessor,pSVar3);
    LinkedList<soul::heart::Statement>::Iterator::operator++((Iterator *)&local_40);
  }
  if (*(long *)((long)__child_stack + 0x40) != 0) {
    pTVar4 = pool_ptr<soul::heart::Terminator>::operator*
                       ((pool_ptr<soul::heart::Terminator> *)((long)__child_stack + 0x40));
    pTVar4 = cloneTerminator(this,pTVar4);
    *(Terminator **)(p_Var2 + 0x40) = pTVar4;
    return (int)pTVar4;
  }
  throwInternalCompilerError("old.isTerminated()","clone",0x137);
}

Assistant:

void clone (heart::Block& b, const heart::Block& old)
    {
        LinkedList<heart::Statement>::Iterator last;

        for (auto p : old.parameters)
            b.parameters.push_back (cloneVariable (p));

        for (auto s : old.statements)
            last = b.statements.insertAfter (last, cloneStatement (*s));

        SOUL_ASSERT (old.isTerminated());
        b.terminator = cloneTerminator (*old.terminator);
    }